

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IndexSpaceI.H
# Opt level: O3

void __thiscall
amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>::
IndexSpaceImp(IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> *this,
             GeometryShop<amrex::EB2::ParserIF,_amrex::Parser> *gshop,Geometry *geom,
             int required_coarsening_level,int max_coarsening_level,int ngrow,
             bool build_coarse_level_by_coarsening,bool extend_domain_face,int num_coarsen_opt)

{
  Vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  *this_00;
  pointer *ppGVar1;
  pointer *ppBVar2;
  Real *pRVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  pointer pGVar8;
  pointer pGVar9;
  uint uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  *pvVar14;
  vector<amrex::Box,_std::allocator<amrex::Box>_> *pvVar15;
  vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *pvVar16;
  vector<int,_std::allocator<int>_> *pvVar17;
  bool bVar18;
  int iVar19;
  uint uVar20;
  long *plVar21;
  int iVar22;
  ulong uVar23;
  Real *pRVar24;
  size_type *psVar25;
  uint uVar26;
  long lVar27;
  Level *this_01;
  uint uVar28;
  bool extend_domain_face_local;
  uint local_19c;
  int ng;
  int local_194;
  string __str;
  Box result;
  long *local_118 [2];
  long local_108 [2];
  Geometry cgeom;
  
  extend_domain_face_local = extend_domain_face;
  (this->super_IndexSpace)._vptr_IndexSpace = (_func_int **)&PTR__IndexSpaceImp_0080e248;
  (this->m_gshop).m_f.m_parser.m_host_executor = (gshop->m_f).m_parser.m_host_executor;
  (this->m_gshop).m_resource.m_data.
  super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (gshop->m_resource).m_data.
       super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (gshop->m_resource).m_data.
           super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_gshop).m_resource.m_data.
  super___shared_ptr<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var4;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  this->m_build_coarse_level_by_coarsening = build_coarse_level_by_coarsening;
  this->m_extend_domain_face = extend_domain_face;
  this->m_num_coarsen_opt = num_coarsen_opt;
  this_00 = &this->m_gslevel;
  pvVar14 = &(this->m_gslevel).
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  ;
  (pvVar14->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar14->
  super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_gslevel).
    super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
    .
    super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar16 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  (pvVar16->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar16->super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar15 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>;
  (pvVar15->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar15->super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (undefined1  [16])0x0;
  pvVar17 = &(this->m_ngrow).super_vector<int,_std::allocator<int>_>;
  (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (pvVar17->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0x1e < (uint)required_coarsening_level) {
    Assert_host("required_coarsening_level >= 0 && required_coarsening_level <= 30",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/EB/AMReX_EB2_IndexSpaceI.H"
                ,0xe,(char *)0x0);
  }
  if (max_coarsening_level < required_coarsening_level) {
    max_coarsening_level = required_coarsening_level;
  }
  iVar19 = 0x1e;
  if (max_coarsening_level < 0x1e) {
    iVar19 = max_coarsening_level;
  }
  local_194 = 0;
  if (0 < ngrow) {
    local_194 = ngrow;
  }
  iVar22 = required_coarsening_level;
  if (0 < required_coarsening_level) {
    do {
      local_194 = local_194 * 2;
      iVar22 = iVar22 + -1;
    } while (iVar22 != 0);
  }
  iVar5._M_current =
       (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar5,geom);
  }
  else {
    memcpy(iVar5._M_current,geom,200);
    ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  iVar6._M_current =
       (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar6._M_current ==
      (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
              ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar6,&geom->domain)
    ;
  }
  else {
    uVar11 = *(undefined8 *)(geom->domain).smallend.vect;
    uVar12 = *(undefined8 *)((geom->domain).smallend.vect + 2);
    uVar13 = *(undefined8 *)((geom->domain).bigend.vect + 2);
    *(undefined8 *)((iVar6._M_current)->bigend).vect = *(undefined8 *)(geom->domain).bigend.vect;
    *(undefined8 *)(((iVar6._M_current)->bigend).vect + 2) = uVar13;
    *(undefined8 *)((iVar6._M_current)->smallend).vect = uVar11;
    *(undefined8 *)(((iVar6._M_current)->smallend).vect + 2) = uVar12;
    ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppBVar2 = *ppBVar2 + 1;
  }
  iVar7._M_current =
       (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (iVar7._M_current ==
      (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar7,&local_194);
  }
  else {
    *iVar7._M_current = local_194;
    (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         iVar7._M_current + 1;
  }
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
  ::reserve(&this_00->
             super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
            ,(long)(iVar19 + 1));
  cgeom.super_CoordSys._0_8_ = this;
  std::
  vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
  ::
  emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>const&,amrex::Geometry_const&,int&,int&,bool&,int&>
            ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
              *)this_00,
             (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> **)
             &cgeom,gshop,geom,&EB2::max_grid_size,&local_194,&extend_domain_face_local,
             &num_coarsen_opt);
  local_19c = 1;
  if (0 < max_coarsening_level) {
    do {
      cgeom.super_CoordSys.c_sys = SPHERICAL;
      cgeom.super_CoordSys._4_4_ = 2;
      cgeom.super_CoordSys.offset[0] = (Real)CONCAT44(cgeom.super_CoordSys.offset[0]._4_4_,2);
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      bVar18 = Box::coarsenable(&(this->m_geom).
                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1].domain,
                                (IntVect *)&cgeom,(IntVect *)&__str);
      if (!bVar18) {
        if (required_coarsening_level < (int)local_19c) {
          return;
        }
        uVar10 = -local_19c;
        if (0 < (int)local_19c) {
          uVar10 = local_19c;
        }
        uVar26 = 1;
        if (9 < uVar10) {
          uVar23 = (ulong)uVar10;
          uVar28 = 4;
          do {
            uVar26 = uVar28;
            uVar20 = (uint)uVar23;
            if (uVar20 < 100) {
              uVar26 = uVar26 - 2;
              goto LAB_00606e8f;
            }
            if (uVar20 < 1000) {
              uVar26 = uVar26 - 1;
              goto LAB_00606e8f;
            }
            if (uVar20 < 10000) goto LAB_00606e8f;
            uVar23 = uVar23 / 10000;
            uVar28 = uVar26 + 4;
          } while (99999 < uVar20);
          uVar26 = uVar26 + 1;
        }
LAB_00606e8f:
        uVar28 = local_19c >> 0x1f;
        __str._M_dataplus._M_p = (pointer)&__str.field_2;
        std::__cxx11::string::_M_construct
                  ((ulong)&__str,(char)uVar26 - (char)((int)local_19c >> 0x1f));
        std::__detail::__to_chars_10_impl<unsigned_int>
                  (__str._M_dataplus._M_p + uVar28,uVar26,uVar10);
        plVar21 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x75e195);
        pRVar3 = cgeom.super_CoordSys.offset + 1;
        pRVar24 = (Real *)(plVar21 + 2);
        if ((Real *)*plVar21 == pRVar24) {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys.offset[2] = (Real)plVar21[3];
          cgeom.super_CoordSys._0_8_ = pRVar3;
        }
        else {
          cgeom.super_CoordSys.offset[1] = *pRVar24;
          cgeom.super_CoordSys._0_8_ = (Real *)*plVar21;
        }
        cgeom.super_CoordSys.offset[0] = (Real)plVar21[1];
        *plVar21 = (long)pRVar24;
        plVar21[1] = 0;
        *(undefined1 *)(plVar21 + 2) = 0;
        Abort((string *)&cgeom);
        if ((Real *)cgeom.super_CoordSys._0_8_ != pRVar3) {
          operator_delete((void *)cgeom.super_CoordSys._0_8_,
                          (long)cgeom.super_CoordSys.offset[1] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)__str._M_dataplus._M_p != &__str.field_2) {
          operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
        }
      }
      ng = 0;
      if ((int)local_19c <= required_coarsening_level) {
        ng = (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             [-1] / 2;
      }
      pGVar8 = (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar11 = *(undefined8 *)pGVar8[-1].domain.smallend.vect;
      uVar12 = *(undefined8 *)(pGVar8[-1].domain.smallend.vect + 2);
      uVar13 = *(undefined8 *)(pGVar8[-1].domain.bigend.vect + 2);
      result.bigend.vect[2] = (int)uVar13;
      result.btype.itype = SUB84(uVar13,4);
      result.smallend.vect[2] = (int)uVar12;
      result.smallend.vect[0] = (int)uVar11 >> 1;
      result.smallend.vect[1] = (int)((long)uVar11 >> 0x21);
      result.smallend.vect[2] = result.smallend.vect[2] >> 1;
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      result.btype.itype = SUB84(uVar13,4);
      result.bigend.vect[2] = (int)uVar13;
      result.bigend.vect[2] = result.bigend.vect[2] >> 1;
      result.bigend.vect[0] = (int)((long)uVar12 >> 0x21);
      result.bigend.vect[1] = (int)((long)*(undefined8 *)pGVar8[-1].domain.bigend.vect >> 0x21);
      if (result.btype.itype != 0) {
        cgeom.super_CoordSys.c_sys = cartesian;
        cgeom.super_CoordSys._4_4_ = 0;
        cgeom.super_CoordSys.offset[0] =
             (Real)((ulong)cgeom.super_CoordSys.offset[0] & 0xffffffff00000000);
        lVar27 = 0;
        do {
          if (((result.btype.itype >> ((uint)lVar27 & 0x1f) & 1) != 0) &&
             (result.bigend.vect[lVar27] % *(int *)((long)&__str._M_dataplus._M_p + lVar27 * 4) != 0
             )) {
            *(undefined4 *)((long)cgeom.super_CoordSys.offset + lVar27 * 4 + -8) = 1;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 != 3);
        result.bigend.vect[0] = cgeom.super_CoordSys.c_sys + result.bigend.vect[0];
        result.bigend.vect[1] = cgeom.super_CoordSys._4_4_ + result.bigend.vect[1];
        result.bigend.vect[2] = result.bigend.vect[2] + cgeom.super_CoordSys.offset[0]._0_4_;
      }
      __str._M_dataplus._M_p = (pointer)0x200000002;
      __str._M_string_length = CONCAT44(__str._M_string_length._4_4_,2);
      memcpy(&cgeom,pGVar8 + -1,200);
      Geometry::coarsen(&cgeom,(IntVect *)&__str);
      __str._M_dataplus._M_p = (pointer)this;
      std::
      vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
      ::
      emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,int&,int&,int&,amrex::Geometry&,amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>&>
                ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
                  *)this_00,
                 (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_> **)
                 &__str,(int *)&local_19c,&EB2::max_grid_size,&ng,&cgeom,
                 (this->m_gslevel).
                 super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
                 .
                 super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)(int)local_19c + -1);
      pGVar9 = (this->m_gslevel).
               super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
               .
               super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pGVar9[-1].super_Level.m_ok == false) {
        this_01 = &pGVar9[-1].super_Level;
        (this->m_gslevel).
        super_vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
        .
        super__Vector_base<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>,_std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)this_01;
        Level::~Level(this_01);
        if (required_coarsening_level < (int)local_19c) {
          return;
        }
        if (build_coarse_level_by_coarsening) {
          uVar10 = -local_19c;
          if (0 < (int)local_19c) {
            uVar10 = local_19c;
          }
          uVar26 = 1;
          if (9 < uVar10) {
            uVar23 = (ulong)uVar10;
            uVar28 = 4;
            do {
              uVar26 = uVar28;
              uVar20 = (uint)uVar23;
              if (uVar20 < 100) {
                uVar26 = uVar26 - 2;
                goto LAB_006071c5;
              }
              if (uVar20 < 1000) {
                uVar26 = uVar26 - 1;
                goto LAB_006071c5;
              }
              if (uVar20 < 10000) goto LAB_006071c5;
              uVar23 = uVar23 / 10000;
              uVar28 = uVar26 + 4;
            } while (99999 < uVar20);
            uVar26 = uVar26 + 1;
          }
LAB_006071c5:
          uVar28 = local_19c >> 0x1f;
          local_118[0] = local_108;
          std::__cxx11::string::_M_construct
                    ((ulong)local_118,(char)uVar26 - (char)((int)local_19c >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)((ulong)uVar28 + (long)local_118[0]),uVar26,uVar10);
          plVar21 = (long *)std::__cxx11::string::replace((ulong)local_118,0,(char *)0x0,0x75e1c8);
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          psVar25 = (size_type *)(plVar21 + 2);
          if ((size_type *)*plVar21 == psVar25) {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str.field_2._8_8_ = plVar21[3];
          }
          else {
            __str.field_2._M_allocated_capacity = *psVar25;
            __str._M_dataplus._M_p = (pointer)*plVar21;
          }
          __str._M_string_length = plVar21[1];
          *plVar21 = (long)psVar25;
          plVar21[1] = 0;
          *(undefined1 *)(plVar21 + 2) = 0;
          Abort(&__str);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
          }
          if (local_118[0] != local_108) {
            operator_delete(local_118[0],local_108[0] + 1);
          }
        }
        else {
          local_118[0] = (long *)CONCAT44(local_118[0]._4_4_,num_coarsen_opt - local_19c);
          __str._M_dataplus._M_p = (pointer)this;
          std::
          vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
          ::
          emplace_back<amrex::EB2::IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>*,amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>const&,amrex::Geometry&,int&,int&,bool&,int>
                    ((vector<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>,std::allocator<amrex::EB2::GShopLevel<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,amrex::Parser>>>>
                      *)this_00,
                     (IndexSpaceImp<amrex::EB2::GeometryShop<amrex::EB2::ParserIF,_amrex::Parser>_>
                      **)&__str,gshop,&cgeom,&EB2::max_grid_size,&ng,&extend_domain_face_local,
                     (int *)local_118);
        }
      }
      iVar5._M_current =
           (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
        _M_realloc_insert<amrex::Geometry_const&>
                  ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)&this->m_geom,iVar5,
                   &cgeom);
      }
      else {
        memcpy(iVar5._M_current,&cgeom,200);
        ppGVar1 = &(this->m_geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      iVar6._M_current =
           (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Box,std::allocator<amrex::Box>>::_M_realloc_insert<amrex::Box_const&>
                  ((vector<amrex::Box,std::allocator<amrex::Box>> *)&this->m_domain,iVar6,&result);
      }
      else {
        *(ulong *)((iVar6._M_current)->bigend).vect =
             CONCAT44(result.bigend.vect[1],result.bigend.vect[0]);
        *(undefined8 *)(((iVar6._M_current)->bigend).vect + 2) = result._20_8_;
        *(undefined8 *)((iVar6._M_current)->smallend).vect = result.smallend.vect._0_8_;
        *(ulong *)(((iVar6._M_current)->smallend).vect + 2) =
             CONCAT44(result.bigend.vect[0],result.smallend.vect[2]);
        ppBVar2 = &(this->m_domain).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppBVar2 = *ppBVar2 + 1;
      }
      iVar7._M_current =
           (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_ngrow,iVar7,&ng);
      }
      else {
        *iVar7._M_current = ng;
        (this->m_ngrow).super_vector<int,_std::allocator<int>_>.
        super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar7._M_current + 1;
      }
      bVar18 = (int)local_19c < iVar19;
      local_19c = local_19c + 1;
    } while (bVar18);
  }
  return;
}

Assistant:

IndexSpaceImp<G>::IndexSpaceImp (const G& gshop, const Geometry& geom,
                                 int required_coarsening_level,
                                 int max_coarsening_level,
                                 int ngrow, bool build_coarse_level_by_coarsening,
                                 bool extend_domain_face, int num_coarsen_opt)
    : m_gshop(gshop),
      m_build_coarse_level_by_coarsening(build_coarse_level_by_coarsening),
      m_extend_domain_face(extend_domain_face),
      m_num_coarsen_opt(num_coarsen_opt)
{
    // build finest level (i.e., level 0) first
    AMREX_ALWAYS_ASSERT(required_coarsening_level >= 0 && required_coarsening_level <= 30);
    max_coarsening_level = std::max(required_coarsening_level,max_coarsening_level);
    max_coarsening_level = std::min(30,max_coarsening_level);

    int ngrow_finest = std::max(ngrow,0);
    for (int i = 1; i <= required_coarsening_level; ++i) {
        ngrow_finest *= 2;
    }

    m_geom.push_back(geom);
    m_domain.push_back(geom.Domain());
    m_ngrow.push_back(ngrow_finest);
    m_gslevel.reserve(max_coarsening_level+1);
    m_gslevel.emplace_back(this, gshop, geom, EB2::max_grid_size, ngrow_finest, extend_domain_face,
                           num_coarsen_opt);

    for (int ilev = 1; ilev <= max_coarsening_level; ++ilev)
    {
        bool coarsenable = m_geom.back().Domain().coarsenable(2,2);
        if (!coarsenable) {
            if (ilev <= required_coarsening_level) {
                amrex::Abort("IndexSpaceImp: domain is not coarsenable at level "+std::to_string(ilev));
            } else {
                break;
            }
        }

        int ng = (ilev > required_coarsening_level) ? 0 : m_ngrow.back()/2;

        Box cdomain = amrex::coarsen(m_geom.back().Domain(),2);
        Geometry cgeom = amrex::coarsen(m_geom.back(),2);
        m_gslevel.emplace_back(this, ilev, EB2::max_grid_size, ng, cgeom, m_gslevel[ilev-1]);
        if (!m_gslevel.back().isOK()) {
            m_gslevel.pop_back();
            if (ilev <= required_coarsening_level) {
                if (build_coarse_level_by_coarsening) {
                    amrex::Abort("Failed to build required coarse EB level "+std::to_string(ilev));
                } else {
                    m_gslevel.emplace_back(this, gshop, cgeom, EB2::max_grid_size, ng, extend_domain_face,
                                           num_coarsen_opt-ilev);
                }
            } else {
                break;
            }
        }
        m_geom.push_back(cgeom);
        m_domain.push_back(cdomain);
        m_ngrow.push_back(ng);
    }
}